

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O3

void helper_gvec_usadd16_riscv32(void *d,void *a,void *b,uint32_t desc)

{
  undefined2 uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar3 = desc * 8 & 0xff;
  uVar4 = 0;
  do {
    uVar2 = (uint)*(ushort *)((long)b + uVar4) + (uint)*(ushort *)((long)a + uVar4);
    uVar1 = (undefined2)uVar2;
    if (0xfffe < uVar2) {
      uVar1 = 0xffff;
    }
    *(undefined2 *)((long)d + uVar4) = uVar1;
    uVar4 = uVar4 + 2;
  } while (uVar4 < uVar3 + 8);
  if (uVar3 < (desc >> 2 & 0xf8)) {
    helper_gvec_usadd16_riscv32_cold_1();
  }
  return;
}

Assistant:

void HELPER(gvec_usadd16)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(uint16_t)) {
        unsigned r = *(uint16_t *)((char *)a + i) + *(uint16_t *)((char *)b + i);
        if (r > UINT16_MAX) {
            r = UINT16_MAX;
        }
        *(uint16_t *)((char *)d + i) = r;
    }
    clear_high(d, oprsz, desc);
}